

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tester.h
# Opt level: O2

void __thiscall
psy::Tester::
run<psy::C::SemanticModelTester,std::vector<std::pair<std::function<void(psy::C::SemanticModelTester*)>,char_const*>,std::allocator<std::pair<std::function<void(psy::C::SemanticModelTester*)>,char_const*>>>>
          (Tester *this,
          vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
          *tests)

{
  pointer ppVar1;
  ostream *poVar2;
  pointer ppVar3;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> testData;
  function<void_(psy::C::SemanticModelTester_*)> curTestFunc;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_78;
  function<void_(psy::C::SemanticModelTester_*)> local_50;
  
  ppVar1 = (tests->
           super__Vector_base<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (tests->
                super__Vector_base<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::pair
              (&local_78,ppVar3);
    (*this->_vptr_Tester[3])(this);
    std::__cxx11::string::assign((char *)&this->curTestFunc_);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t");
    poVar2 = std::operator<<(poVar2,(string *)&C::SemanticModelTester::Name_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"-");
    poVar2 = std::operator<<(poVar2,(string *)&this->curTestFunc_);
    std::operator<<(poVar2,"... ");
    std::function<void_(psy::C::SemanticModelTester_*)>::function(&local_50,&local_78.first);
    std::function<void_(psy::C::SemanticModelTester_*)>::operator()
              (&local_50,(SemanticModelTester *)this);
    std::operator<<((ostream *)&std::cout,"OK");
    this->cntPassed_ = this->cntPassed_ + 1;
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "\n\t-------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    (*this->_vptr_Tester[4])(this);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  return;
}

Assistant:

void run(const TestContT& tests)
    {
        for (auto testData : tests) {
            setUp();

            curTestFunc_ = testData.second;
            std::cout << "\t" << TesterT::Name << "-" << curTestFunc_ << "... ";

            try {
                auto curTestFunc = testData.first;
                curTestFunc(static_cast<TesterT*>(this));
                std::cout << "OK";
                ++cntPassed_;
            } catch (const TestFailed&) {
                ++cntFailed_;
            }
            std::cout << "\n\t-------------------------------------------------" << std::endl;

            tearDown();
        }
    }